

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnEndExpr
          (BinaryReaderObjdumpDisassemble *this)

{
  if (this->in_function_body == true) {
    if (0 < this->indent_level) {
      this->indent_level = this->indent_level + -1;
    }
    LogOpcode(this,(char *)0x0,0);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnEndExpr() {
  if (!in_function_body) {
    return Result::Ok;
  }
  if (indent_level > 0) {
    indent_level--;
  }
  LogOpcode(0, nullptr);
  return Result::Ok;
}